

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

iterator * __thiscall
google::
sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::operator++(sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *this)

{
  sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
  *psVar1;
  sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
  *psVar2;
  sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
  *psVar3;
  sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
  *psVar4;
  pointer ppVar5;
  
  psVar1 = (this->pos).row_current._M_current;
  ppVar5 = (this->pos).col_current + 1;
  (this->pos).col_current = ppVar5;
  if (ppVar5 == psVar1->group + (psVar1->settings).num_buckets) {
    psVar2 = (this->pos).row_end._M_current;
    do {
      psVar4 = psVar1 + 1;
      if (psVar4 == psVar2) break;
      (this->pos).col_current = psVar4->group;
      psVar3 = psVar1 + 1;
      psVar1 = psVar4;
    } while ((psVar3->settings).num_buckets == 0);
    (this->pos).row_current._M_current = psVar4;
  }
  advance_past_deleted(this);
  return this;
}

Assistant:

iterator& operator++() {
    assert(pos != end);
    ++pos;
    advance_past_deleted();
    return *this;
  }